

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::SetMotorVoltage(AmpIO *this,uint index,double volts)

{
  bool bVar1;
  uint32_t uVar2;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if ((uVar2 != 0x64524131) &&
     (uVar2 = (uint32_t)(long)((volts + 45.5) * 720.1648351648352 + 0.5), uVar2 < 0x10000)) {
    bVar1 = SetMotorVoltage(this,index,uVar2);
    return bVar1;
  }
  return false;
}

Assistant:

bool AmpIO::SetMotorVoltage(unsigned int index, double volts)
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    const double Volts2BitsQLA = 65535/91.0;   // 91.0 = 36.4*2.5
    uint32_t bits = static_cast<uint32_t>((volts+45.5)*Volts2BitsQLA+0.5);
    if (bits&0xffff0000)
        return false;    // volts too high or low (could instead truncate)
    return SetMotorVoltage(index, bits);
}